

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O2

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPointAccelerationError
          (ContactConstraint *this,
          vector<Vector3_t,_std::allocator<Vector3_t>_> *pointAccelerationsSys,VectorNd *ddErrSysUpd
          )

{
  long lVar1;
  uint i;
  ulong uVar2;
  ResScalar RVar3;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < (this->super_Constraint).sizeOfConstraint; uVar2 = uVar2 + 1) {
    RVar3 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
            ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  (*(long *)&(this->super_Constraint).field_0xd8 + lVar1),
                  (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                  ((pointAccelerationsSys->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>
                   )._M_impl.super__Vector_impl_data._M_start +
                  ((this->super_Constraint).rowInSystem + (int)uVar2)));
    (ddErrSysUpd->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    [(this->super_Constraint).rowInSystem + (int)uVar2] = RVar3;
    lVar1 = lVar1 + 0x18;
  }
  return;
}

Assistant:

void ContactConstraint::
      calcPointAccelerationError(
                    const std::vector<Math::Vector3d> &pointAccelerationsSys,
                    Math::VectorNd &ddErrSysUpd)
{
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    ddErrSysUpd[rowInSystem+i] =
        T[i].dot(pointAccelerationsSys[rowInSystem+i]);
  }
}